

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CpuBackend.cpp
# Opt level: O2

void __thiscall xmrig::CpuBackend::stop(CpuBackend *this)

{
  CpuBackendPrivate *pCVar1;
  pointer pCVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  
  if ((this->d_ptr->threads).
      super__Vector_base<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->d_ptr->threads).
      super__Vector_base<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    uVar3 = Chrono::steadyMSecs();
    Workers<xmrig::CpuLaunchData>::stop(&this->d_ptr->workers);
    pCVar1 = this->d_ptr;
    pCVar2 = (pCVar1->threads).
             super__Vector_base<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>._M_impl
             .super__Vector_impl_data._M_start;
    if ((pCVar1->threads).
        super__Vector_base<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>._M_impl.
        super__Vector_impl_data._M_finish != pCVar2) {
      (pCVar1->threads).
      super__Vector_base<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>._M_impl.
      super__Vector_impl_data._M_finish = pCVar2;
    }
    uVar4 = Chrono::steadyMSecs();
    Log::print(INFO,"%s\x1b[0;33m stopped\x1b[0m\x1b[1;30m (%lu ms)\x1b[0m",
               "\x1b[46;1m\x1b[1;37m cpu \x1b[0m",uVar4 - uVar3);
    return;
  }
  return;
}

Assistant:

void xmrig::CpuBackend::stop()
{
    if (d_ptr->threads.empty()) {
        return;
    }

    const uint64_t ts = Chrono::steadyMSecs();

    d_ptr->workers.stop();
    d_ptr->threads.clear();

    LOG_INFO("%s" YELLOW(" stopped") BLACK_BOLD(" (%" PRIu64 " ms)"), tag, Chrono::steadyMSecs() - ts);
}